

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool ImGui::BeginChildEx(char *name,ImGuiID id,ImVec2 *size_arg,bool border,ImGuiWindowFlags flags)

{
  float fVar1;
  ImGuiWindow *pIVar2;
  bool bVar3;
  ImGuiContext *pIVar4;
  bool bVar5;
  byte in_CL;
  byte bVar6;
  uint in_ESI;
  long in_RDI;
  uint in_R8D;
  ImVec2 IVar7;
  ImGuiWindow *child_window;
  bool ret;
  float backup_border_size;
  char title [256];
  int auto_fit_axises;
  ImVec2 size;
  ImVec2 content_avail;
  ImGuiWindow *parent_window;
  ImGuiContext *g;
  ImGuiWindowFlags in_stack_00000224;
  bool *in_stack_00000228;
  char *in_stack_00000230;
  ImVec2 *in_stack_fffffffffffffea8;
  ImGuiWindow *window;
  char local_148 [4];
  ImGuiCond in_stack_fffffffffffffebc;
  ImVec2 *in_stack_fffffffffffffec0;
  undefined1 in_stack_fffffffffffffecf;
  ImGuiWindow *in_stack_fffffffffffffed0;
  ImVec2 local_40;
  float local_38;
  float fStack_34;
  
  pIVar4 = GImGui;
  pIVar2 = GImGui->CurrentWindow;
  IVar7 = GetContentRegionAvail();
  local_40 = ImFloor(in_stack_fffffffffffffea8);
  bVar3 = local_40.x == 0.0;
  bVar6 = 0;
  if (local_40.y == 0.0) {
    bVar6 = 2;
  }
  if (local_40.x <= 0.0) {
    local_38 = IVar7.x;
    ImMax<float>(local_38 + local_40.x,4.0);
    local_40 = (ImVec2)((ulong)(uint)local_40.y << 0x20);
  }
  if (local_40.y <= 0.0) {
    fStack_34 = IVar7.y;
    ImMax<float>(fStack_34 + local_40.y,4.0);
  }
  SetNextWindowSize(in_stack_fffffffffffffec0,in_stack_fffffffffffffebc);
  if (in_RDI == 0) {
    ImFormatString(local_148,0x100,"%s/%08X",pIVar2->Name,(ulong)in_ESI);
  }
  else {
    ImFormatString(local_148,0x100,"%s/%s_%08X",pIVar2->Name,in_RDI,(ulong)in_ESI);
  }
  fVar1 = (pIVar4->Style).ChildBorderSize;
  if ((in_CL & 1) == 0) {
    (pIVar4->Style).ChildBorderSize = 0.0;
  }
  bVar5 = Begin(in_stack_00000230,in_stack_00000228,in_stack_00000224);
  (pIVar4->Style).ChildBorderSize = fVar1;
  window = pIVar4->CurrentWindow;
  window->ChildId = in_ESI;
  window->AutoFitChildAxises = bVar3 | bVar6;
  if (window->BeginCount == 1) {
    (pIVar2->DC).CursorPos = window->Pos;
  }
  if (((pIVar4->NavActivateId == in_ESI) && ((in_R8D & 0x800000) == 0)) &&
     (((window->DC).NavLayerActiveMask != 0 || (((window->DC).NavHasScroll & 1U) != 0)))) {
    FocusWindow(in_stack_fffffffffffffed0);
    NavInitWindow(in_stack_fffffffffffffed0,(bool)in_stack_fffffffffffffecf);
    SetActiveID(in_ESI + 1,window);
    pIVar4->ActiveIdSource = ImGuiInputSource_Nav;
  }
  return bVar5;
}

Assistant:

bool ImGui::BeginChildEx(const char* name, ImGuiID id, const ImVec2& size_arg, bool border, ImGuiWindowFlags flags)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* parent_window = g.CurrentWindow;

    flags |= ImGuiWindowFlags_NoTitleBar|ImGuiWindowFlags_NoResize|ImGuiWindowFlags_NoSavedSettings|ImGuiWindowFlags_ChildWindow;
    flags |= (parent_window->Flags & ImGuiWindowFlags_NoMove);  // Inherit the NoMove flag

    // Size
    const ImVec2 content_avail = GetContentRegionAvail();
    ImVec2 size = ImFloor(size_arg);
    const int auto_fit_axises = ((size.x == 0.0f) ? (1 << ImGuiAxis_X) : 0x00) | ((size.y == 0.0f) ? (1 << ImGuiAxis_Y) : 0x00);
    if (size.x <= 0.0f)
        size.x = ImMax(content_avail.x + size.x, 4.0f); // Arbitrary minimum child size (0.0f causing too much issues)
    if (size.y <= 0.0f)
        size.y = ImMax(content_avail.y + size.y, 4.0f);
    SetNextWindowSize(size);

    // Build up name. If you need to append to a same child from multiple location in the ID stack, use BeginChild(ImGuiID id) with a stable value.
    char title[256];
    if (name)
        ImFormatString(title, IM_ARRAYSIZE(title), "%s/%s_%08X", parent_window->Name, name, id);
    else
        ImFormatString(title, IM_ARRAYSIZE(title), "%s/%08X", parent_window->Name, id);

    const float backup_border_size = g.Style.ChildBorderSize;
    if (!border)
        g.Style.ChildBorderSize = 0.0f;
    bool ret = Begin(title, NULL, flags);
    g.Style.ChildBorderSize = backup_border_size;

    ImGuiWindow* child_window = g.CurrentWindow;
    child_window->ChildId = id;
    child_window->AutoFitChildAxises = (ImS8)auto_fit_axises;

    // Set the cursor to handle case where the user called SetNextWindowPos()+BeginChild() manually.
    // While this is not really documented/defined, it seems that the expected thing to do.
    if (child_window->BeginCount == 1)
        parent_window->DC.CursorPos = child_window->Pos;

    // Process navigation-in immediately so NavInit can run on first frame
    if (g.NavActivateId == id && !(flags & ImGuiWindowFlags_NavFlattened) && (child_window->DC.NavLayerActiveMask != 0 || child_window->DC.NavHasScroll))
    {
        FocusWindow(child_window);
        NavInitWindow(child_window, false);
        SetActiveID(id+1, child_window); // Steal ActiveId with a dummy id so that key-press won't activate child item
        g.ActiveIdSource = ImGuiInputSource_Nav;
    }
    return ret;
}